

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O2

void __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::touch_item(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Item *item)

{
  if (this->head != item) {
    unlink_item(this,item);
    link_item(this,item);
    return;
  }
  return;
}

Assistant:

void touch_item(Item& item) const {
    if (this->head != &item) {
      this->unlink_item(&item);
      this->link_item(&item);
    }
  }